

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GatherAlongAxisLayerParams::CopyFrom
          (GatherAlongAxisLayerParams *this,GatherAlongAxisLayerParams *from)

{
  if (from != this) {
    this->axis_ = 0;
    if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
                (&(this->super_MessageLite)._internal_metadata_);
    }
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void GatherAlongAxisLayerParams::CopyFrom(const GatherAlongAxisLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.GatherAlongAxisLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}